

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::CopyJsonNameTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  FieldDescriptor *pFVar4;
  FieldDescriptorProto *pFVar5;
  Descriptor *this_00;
  DescriptorProto *proto_00;
  int local_50;
  int local_4c;
  int i_2;
  int i_1;
  int i;
  LogMessage local_30;
  Voidify local_19;
  DescriptorProto *local_18;
  DescriptorProto *proto_local;
  Descriptor *this_local;
  
  local_18 = proto;
  proto_local = (DescriptorProto *)this;
  iVar1 = field_count(this);
  iVar2 = DescriptorProto::field_size(local_18);
  if (iVar1 == iVar2) {
    iVar1 = nested_type_count(this);
    iVar2 = DescriptorProto::nested_type_size(local_18);
    if (iVar1 == iVar2) {
      iVar1 = extension_count(this);
      iVar2 = DescriptorProto::extension_size(local_18);
      if (iVar1 == iVar2) {
        for (i_2 = 0; iVar1 = field_count(this), i_2 < iVar1; i_2 = i_2 + 1) {
          pFVar4 = field(this,i_2);
          pFVar5 = DescriptorProto::mutable_field(local_18,i_2);
          FieldDescriptor::CopyJsonNameTo(pFVar4,pFVar5);
        }
        for (local_4c = 0; iVar1 = nested_type_count(this), local_4c < iVar1;
            local_4c = local_4c + 1) {
          this_00 = nested_type(this,local_4c);
          proto_00 = DescriptorProto::mutable_nested_type(local_18,local_4c);
          CopyJsonNameTo(this_00,proto_00);
        }
        for (local_50 = 0; iVar1 = extension_count(this), local_50 < iVar1; local_50 = local_50 + 1)
        {
          pFVar4 = extension(this,local_50);
          pFVar5 = DescriptorProto::mutable_extension(local_18,local_50);
          FieldDescriptor::CopyJsonNameTo(pFVar4,pFVar5);
        }
        return;
      }
    }
  }
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0xcb6);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [54])"Cannot copy json_name to a proto of a different size.")
  ;
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_30);
  return;
}

Assistant:

void Descriptor::CopyJsonNameTo(DescriptorProto* proto) const {
  if (field_count() != proto->field_size() ||
      nested_type_count() != proto->nested_type_size() ||
      extension_count() != proto->extension_size()) {
    ABSL_LOG(ERROR) << "Cannot copy json_name to a proto of a different size.";
    return;
  }
  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyJsonNameTo(proto->mutable_field(i));
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyJsonNameTo(proto->mutable_nested_type(i));
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyJsonNameTo(proto->mutable_extension(i));
  }
}